

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddScriptHashSign
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *redeem_script,bool clear_stack,char **tx_string)

{
  bool bVar1;
  AddressType address_type;
  uint32_t uVar2;
  char *pcVar3;
  CfdException *pCVar4;
  allocator local_1aa;
  bool is_bitcoin;
  void *local_1a8;
  Script local_1a0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> list;
  Script script;
  TransactionContext tx;
  OutPoint outpoint;
  
  local_1a8 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x6b7;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d5d;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&script);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x6bd;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d5d;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&script);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(redeem_script);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x6c3;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d5d;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"redeem_script is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. redeem_script is null or empty.",
               (allocator *)&script);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string != (char **)0x0) {
    address_type = cfd::capi::ConvertHashToAddressType(hash_type);
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    std::__cxx11::string::string((string *)&script,txid,(allocator *)&local_1a0);
    cfd::core::Txid::Txid((Txid *)&tx,(string *)&script);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&tx,vout);
    cfd::core::Txid::~Txid((Txid *)&tx);
    std::__cxx11::string::~string((string *)&script);
    list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    list.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&tx,redeem_script,(allocator *)&local_1a0);
    cfd::core::Script::Script(&script,(string *)&tx);
    std::__cxx11::string::~string((string *)&tx);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_1a0,tx_hex_string,&local_1aa);
      cfd::TransactionContext::TransactionContext(&tx,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      uVar2 = cfd::TransactionContext::GetTxInIndex(&tx,&outpoint);
      if (clear_stack) {
        if (address_type - kP2wshAddress < 0xfffffffe) {
          cfd::core::Transaction::RemoveScriptWitnessStackAll(&tx.super_Transaction,uVar2);
        }
        else {
          cfd::core::Script::Script(&local_1a0);
          cfd::core::Transaction::SetUnlockingScript(&tx.super_Transaction,uVar2,&local_1a0);
          cfd::core::Script::~Script(&local_1a0);
        }
      }
      cfd::TransactionContext::AddScriptHashSign(&tx,&outpoint,&list,&script,address_type,false);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&local_1a0,(AbstractTransaction *)&tx);
      pcVar3 = cfd::capi::CreateString((string *)&local_1a0);
      *tx_string = pcVar3;
      std::__cxx11::string::~string((string *)&local_1a0);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&local_1a0,tx_hex_string,&local_1aa);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      uVar2 = cfd::ConfidentialTransactionContext::GetTxInIndex
                        ((ConfidentialTransactionContext *)&tx,&outpoint);
      if (clear_stack) {
        if (address_type - kP2wshAddress < 0xfffffffe) {
          cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll
                    ((ConfidentialTransaction *)&tx,uVar2);
        }
        else {
          cfd::core::Script::Script(&local_1a0);
          cfd::core::ConfidentialTransaction::SetUnlockingScript
                    ((ConfidentialTransaction *)&tx,uVar2,&local_1a0);
          cfd::core::Script::~Script(&local_1a0);
        }
      }
      cfd::ConfidentialTransactionContext::AddScriptHashSign
                ((ConfidentialTransactionContext *)&tx,&outpoint,&list,&script,address_type,false);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&local_1a0,(AbstractTransaction *)&tx);
      pcVar3 = cfd::capi::CreateString((string *)&local_1a0);
      *tx_string = pcVar3;
      std::__cxx11::string::~string((string *)&local_1a0);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
    }
    cfd::core::Script::~Script(&script);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&list);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4fe2f6;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x6c9;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d5d;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx output is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx output is null.",(allocator *)&script);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddScriptHashSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* redeem_script, bool clear_stack,
    char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeem_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeem_script is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    std::vector<SignParameter> list;
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      uint32_t index = tx.GetTxInIndex(outpoint);
      if (clear_stack) {
        if (is_witness) {
          tx.RemoveScriptWitnessStackAll(index);
        } else {
          tx.SetUnlockingScript(index, Script());
        }
      }
      tx.AddScriptHashSign(outpoint, list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      uint32_t index = tx.GetTxInIndex(outpoint);
      if (clear_stack) {
        if (is_witness) {
          tx.RemoveScriptWitnessStackAll(index);
        } else {
          tx.SetUnlockingScript(index, Script());
        }
      }
      tx.AddScriptHashSign(outpoint, list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}